

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers_test.cpp
# Opt level: O0

void __thiscall
UniformLightSampling_PdfMethod_Test::TestBody(UniformLightSampling_PdfMethod_Test *this)

{
  span<const_pbrt::LightHandle> lights_00;
  bool bVar1;
  Message *pMVar2;
  float fVar3;
  AssertionResult gtest_ar;
  float in_stack_000000e8;
  float in_stack_000000ec;
  char *in_stack_000000f0;
  char *in_stack_000000f8;
  AssertionResult gtest_ar_;
  optional<pbrt::SampledLight> sampledLight;
  Interaction intr;
  Point3f p;
  int i;
  UniformLightSampler distrib;
  vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> tris;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  Allocator in_stack_000002d8;
  Interaction *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  Float in_stack_fffffffffffffd34;
  SampledLight *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  float in_stack_fffffffffffffd44;
  LightSampleContext *in_stack_fffffffffffffd48;
  Allocator in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  Type in_stack_fffffffffffffd5c;
  AssertHelper *in_stack_fffffffffffffd60;
  char *expected_predicate_value;
  char *actual_predicate_value;
  char *expression_text;
  AssertionResult *in_stack_fffffffffffffda8;
  AssertHelper *in_stack_fffffffffffffdb0;
  AssertionResult local_210;
  uint local_1fc;
  string local_1f8 [48];
  AssertionResult local_1c8 [4];
  optional local_188 [164];
  int local_e4;
  char local_80 [72];
  char local_38 [24];
  char *local_20;
  char local_18 [24];
  
  expression_text = local_18;
  pbrt::RNG::RNG((RNG *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (uint64_t)in_stack_fffffffffffffd28);
  local_20 = expression_text;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)0x52d200);
  std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>::vector
            ((vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> *)0x52d20d);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  randomLights(this._4_4_,in_stack_000002d8);
  actual_predicate_value = local_38;
  std::
  tie<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>>
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             in_stack_fffffffffffffd38,
             (vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  expected_predicate_value = local_80;
  std::
  tuple<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>&>
  ::operator=((tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_&,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_&>
               *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
              (tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
               *)in_stack_fffffffffffffd28);
  std::
  tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
  ::~tuple((tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
            *)0x52d27e);
  pstd::span<pbrt::LightHandle_const>::
  span<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,void,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>>
            ((span<const_pbrt::LightHandle> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             in_stack_fffffffffffffd38);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  lights_00.ptr._4_4_ = in_stack_fffffffffffffd5c;
  lights_00.ptr._0_4_ = in_stack_fffffffffffffd58;
  lights_00.n = (size_t)in_stack_fffffffffffffd60;
  pbrt::UniformLightSampler::UniformLightSampler
            ((UniformLightSampler *)in_stack_fffffffffffffd48,lights_00,in_stack_fffffffffffffd50);
  for (local_e4 = 0; local_e4 < 100; local_e4 = local_e4 + 1) {
    fVar3 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)0x52d2ea);
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar3),
                    SUB6416(ZEXT464(0xbf800000),0));
    fVar3 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)0x52d320);
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar3),
                    SUB6416(ZEXT464(0xbf800000),0));
    fVar3 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)0x52d356);
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar3),
                    SUB6416(ZEXT464(0xbf800000),0));
    pbrt::Point3<float>::Point3
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (float)((ulong)in_stack_fffffffffffffd28 >> 0x20),SUB84(in_stack_fffffffffffffd28,0),
               0.0);
    pbrt::Point3fi::Point3fi
              ((Point3fi *)in_stack_fffffffffffffd50.memoryResource,
               (Point3f *)in_stack_fffffffffffffd48);
    pbrt::Normal3<float>::Normal3
              ((Normal3<float> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (float)((ulong)in_stack_fffffffffffffd28 >> 0x20),SUB84(in_stack_fffffffffffffd28,0),
               0.0);
    pbrt::Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (float)((ulong)in_stack_fffffffffffffd28 >> 0x20),SUB84(in_stack_fffffffffffffd28,0))
    ;
    pbrt::Interaction::Interaction
              ((Interaction *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               (Point3fi *)in_stack_fffffffffffffd38,
               (Normal3f *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (Point2f *)in_stack_fffffffffffffd28);
    pbrt::LightSampleContext::LightSampleContext
              ((LightSampleContext *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28);
    pbrt::RNG::Uniform<float>((RNG *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    pbrt::UniformLightSampler::Sample
              ((UniformLightSampler *)in_stack_fffffffffffffd38,
               (LightSampleContext *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (Float)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    pstd::optional::operator_cast_to_bool(local_188);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               SUB81((ulong)in_stack_fffffffffffffd28 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd60);
      in_stack_fffffffffffffd60 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                      (int *)in_stack_fffffffffffffd28);
      pMVar2 = testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                          (char (*) [4])in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd5c = (Type)((ulong)pMVar2 >> 0x20);
      in_stack_fffffffffffffd50.memoryResource =
           (memory_resource *)
           testing::Message::operator<<
                     ((Message *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                      (Point3<float> *)in_stack_fffffffffffffd28);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffda8,expression_text,actual_predicate_value,
                 expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                 (char *)in_stack_fffffffffffffd50.memoryResource,
                 (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      std::__cxx11::string::~string(local_1f8);
      testing::Message::~Message((Message *)0x52d5fa);
    }
    local_1fc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x52d68b);
    if (local_1fc == 0) {
      in_stack_fffffffffffffd48 =
           (LightSampleContext *)
           pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x52d6a9);
      in_stack_fffffffffffffd44 =
           (in_stack_fffffffffffffd48->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      pbrt::LightSampleContext::LightSampleContext
                ((LightSampleContext *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                 ,in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd38 =
           pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x52d6e4);
      pbrt::LightHandle::LightHandle
                ((LightHandle *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (LightHandle *)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd34 =
           pbrt::UniformLightSampler::PDF
                     ((UniformLightSampler *)in_stack_fffffffffffffd50.memoryResource,
                      in_stack_fffffffffffffd48,
                      (LightHandle *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      testing::internal::CmpHelperFloatingPointEQ<float>
                (in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
      in_stack_fffffffffffffd30 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd30);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd60);
        in_stack_fffffffffffffd28 =
             (Interaction *)testing::AssertionResult::failure_message((AssertionResult *)0x52d7b6);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                   (char *)in_stack_fffffffffffffd50.memoryResource,
                   (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        testing::Message::~Message((Message *)0x52d811);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x52d866);
      local_1fc = 0;
    }
    pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x52d87e);
    if (local_1fc != 0) goto LAB_0052d8ca;
  }
  local_1fc = 0;
LAB_0052d8ca:
  pbrt::UniformLightSampler::~UniformLightSampler((UniformLightSampler *)0x52d8d7);
  std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>::~vector
            ((vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  return;
}

Assistant:

TEST(UniformLightSampling, PdfMethod) {
    RNG rng(5251);
    auto r = [&rng]() { return rng.Uniform<Float>(); };

    std::vector<LightHandle> lights;
    std::vector<ShapeHandle> tris;
    std::tie(lights, tris) = randomLights(20, Allocator());

    UniformLightSampler distrib(lights, Allocator());
    for (int i = 0; i < 100; ++i) {
        Point3f p(-1 + 3 * r(), -1 + 3 * r(), -1 + 3 * r());
        Interaction intr(Point3fi(p), Normal3f(0, 0, 0), Point2f(0, 0));
        pstd::optional<SampledLight> sampledLight =
            distrib.Sample(intr, rng.Uniform<Float>());
        ASSERT_TRUE((bool)sampledLight) << i << " - " << p;
        EXPECT_FLOAT_EQ(sampledLight->pdf, distrib.PDF(intr, sampledLight->light));
    }
}